

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void flatbuffers::Print<signed_char>
               (char val,Type type,int indent,int indent_step,StructDef *param_5,string *_text)

{
  string local_50;
  string *local_30;
  string *text;
  string *_text_local;
  StructDef *param_4_local;
  int local_10;
  int indent_step_local;
  int indent_local;
  char val_local;
  
  local_30 = _text;
  text = _text;
  _text_local = (string *)param_5;
  param_4_local._4_4_ = indent_step;
  local_10 = indent;
  indent_step_local._3_1_ = val;
  NumToString<signed_char>(&local_50,val);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Print(T val, Type type, int indent, int indent_step,
                                StructDef * /*union_sd*/, std::string *_text) {
  std::string &text = *_text;
  text += NumToString(val);
}